

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O1

int amqp_timer_update(amqp_timer_t *timer,timeval *timeout)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  timespec tp;
  timespec local_20;
  
  if (timer->current_timestamp == 0) {
    iVar1 = clock_gettime(1,&local_20);
    if (iVar1 == -1) {
      uVar2 = 0;
    }
    else {
      uVar2 = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
    }
    timer->current_timestamp = uVar2;
    if (uVar2 != 0) {
      timer->timeout_timestamp = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + uVar2;
      goto LAB_0010cd09;
    }
  }
  else {
    iVar1 = clock_gettime(1,&local_20);
    if (iVar1 == -1) {
      uVar2 = 0;
    }
    else {
      uVar2 = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
    }
    timer->current_timestamp = uVar2;
    if (uVar2 != 0) {
LAB_0010cd09:
      uVar3 = timer->timeout_timestamp - timer->current_timestamp;
      if (timer->timeout_timestamp < timer->current_timestamp) {
        return -0xd;
      }
      timer->ns_until_next_timeout = uVar3;
      (timer->tv).tv_sec = 0;
      (timer->tv).tv_usec = 0;
      (timer->tv).tv_sec = uVar3 / 1000000000;
      (timer->tv).tv_usec = (uVar3 % 1000000000) / 1000;
      return 0;
    }
  }
  return -0xe;
}

Assistant:

int
amqp_timer_update(amqp_timer_t *timer, struct timeval *timeout)
{
  if (0 == timer->current_timestamp) {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }

    timer->timeout_timestamp = timer->current_timestamp +
                               (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
                               (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  } else {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
  }

  if (timer->current_timestamp > timer->timeout_timestamp) {
    return AMQP_STATUS_TIMEOUT;
  }

  timer->ns_until_next_timeout = timer->timeout_timestamp - timer->current_timestamp;

  memset(&timer->tv, 0, sizeof(struct timeval));
  timer->tv.tv_sec = timer->ns_until_next_timeout / AMQP_NS_PER_S;
  timer->tv.tv_usec = (timer->ns_until_next_timeout % AMQP_NS_PER_S) / AMQP_NS_PER_US;

  return AMQP_STATUS_OK;
}